

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniformxx.hpp
# Opt level: O0

ret_t trng::utility::
      u01xx_traits<float,_1UL,_generator_max<trng::lagfib2plus<unsigned_int,_168U,_521U>_>_>::
      variate_max(void)

{
  size_t i;
  ret_t ret;
  ret_t max_addin;
  ret_t scale_per_step;
  
  return 4.2949673e+09;
}

Assistant:

TRNG_CUDA_ENABLE
      static ret_t variate_max() {
        const ret_t scale_per_step{static_cast<ret_t>(domain_max) + 1};
        const ret_t max_addin{static_cast<ret_t>(domain_max)};
        ret_t ret{max_addin};
        for (std::size_t i{1}; i < calls_needed; ++i)
          ret = ret * scale_per_step + max_addin;
        return ret;
      }